

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void variance_double_suite::test_linear_decrease(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  double *in_stack_ffffffffffffff88;
  double local_70;
  ulong local_68;
  moment_variance<double> filter;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::basic_moment
            (&filter,0.125,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,10.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 10.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x180,"void variance_double_suite::test_linear_decrease()",&local_68,&local_70);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x181,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,predicate
            );
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,9.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 9.46667;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","9.46667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x183,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_00);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.124444;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x184,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,8.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 8.91124;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.91124","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x186,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_02);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.429707;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.429707","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x187,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,7.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 8.33392;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.33392","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x189,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_04);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.923291;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.923291","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18a,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,6.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 7.73498;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.73498","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18c,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_06);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 1.60733;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.60733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18d,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,5.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 7.11475;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.11475","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18f,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_08);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 2.47861;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.47861","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x190,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_09);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,4.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 6.47365;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.47365","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x192,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_10);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 3.52889;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.52889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x193,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,3.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 5.81214;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.81214","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x195,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_12);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 4.7455;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","4.7455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x196,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_13);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,2.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 5.13076;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.13076","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x198,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_14);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 6.11216;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","6.11216","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x199,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_15);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 4.43009;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.43009","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x19b,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_16);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 7.60984;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","7.60984","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x19c,0x10c674,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_17);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 9.46667, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 8.91124, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.429707, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 8.33392, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.923291, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 7.73498, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.60733, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 7.11475, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.47861, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 6.47365, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 3.52889, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 5.81214, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 4.7455, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 5.13076, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 6.11216, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 4.43009, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 7.60984, tolerance);
}